

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdesolver_non_smooth.c
# Opt level: O1

int main(int argc,char **argv)

{
  double mu;
  double p_rho;
  long lVar1;
  long lVar2;
  uint global_iteration;
  long lVar3;
  
  lVar1 = 0;
  global_iteration = 0;
  do {
    mu = (double)(&DAT_001125a0)[lVar1];
    lVar3 = 0;
    do {
      p_rho = (double)(&DAT_001125e0)[lVar3];
      lVar2 = 0;
      do {
        test_iteration(mu,p_rho,*(double *)((long)&DAT_001125c0 + lVar2),global_iteration,argc,argv)
        ;
        global_iteration = global_iteration + 1;
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x18);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return 0;
}

Assistant:

int main (int argc, char * argv[])
{
  double mu_values[] = {.1, .01, .001};
  const unsigned MU_VALUES_SIZE = 3;
  double eta_values[] = {.1, 1., 10.};
  const unsigned ETA_VALUES_SIZE = 3;
  double p_rho_values[] = {1., 10., 100.};
  const unsigned P_RHO_VALUES_SIZE = 3;

  unsigned i = 0, 
           j = 0, 
           k = 0, 
           global_iteration = 0;

  for (i = 0; i < MU_VALUES_SIZE; ++i) {
    for (j = 0; j < P_RHO_VALUES_SIZE; ++j) {
      for (k = 0; k < ETA_VALUES_SIZE; ++k) {
        test_iteration (mu_values[i], p_rho_values[j], eta_values[k], global_iteration, argc, argv);
        global_iteration += 1;
      }
    }
  }

  return 0;
}